

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  long *plVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  char *pcVar15;
  void *cvode_mem;
  int indexB2;
  int indexB1;
  SUNContext sunctx;
  sunrealtype time;
  int ncheck;
  void *local_d8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined1 (*local_b8) [16];
  double local_b0;
  double local_a8;
  double local_a0;
  long *local_98;
  long *local_90;
  double local_88;
  long local_80;
  long local_78;
  double local_70;
  double local_68;
  uint local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_d8 = (void *)0x0;
  pauVar6 = (undefined1 (*) [16])malloc(0x10);
  *(undefined4 *)*pauVar6 = 0;
  *(undefined4 *)(*pauVar6 + 4) = 0x3ff00000;
  *(undefined4 *)(*pauVar6 + 8) = 0;
  *(undefined4 *)(*pauVar6 + 0xc) = 0x40000000;
  uVar5 = SUNContext_Create(0,&local_c8);
  if ((int)uVar5 < 0) {
    pcVar15 = "SUNContext_Create";
    goto LAB_00103c23;
  }
  plVar7 = (long *)N_VNew_Serial(3,local_c8);
  if (plVar7 == (long *)0x0) {
    main_cold_17();
    return 1;
  }
  N_VConst(0,plVar7);
  plVar8 = (long *)N_VNew_Serial(1,local_c8);
  if (plVar8 == (long *)0x0) {
    main_cold_16();
    return 1;
  }
  N_VConst(0,plVar8);
  puVar9 = (undefined8 *)N_VCloneVectorArray(2,plVar7);
  if (puVar9 == (undefined8 *)0x0) {
    main_cold_15();
    return 1;
  }
  N_VConst(0,*puVar9);
  N_VConst(0,puVar9[1]);
  puVar10 = (undefined8 *)N_VCloneVectorArray(2,plVar8);
  if (puVar10 == (undefined8 *)0x0) {
    main_cold_14();
    return 1;
  }
  N_VConst(0,*puVar10);
  N_VConst(0,puVar10[1]);
  local_d8 = (void *)CVodeCreate(2,local_c8);
  if (local_d8 == (void *)0x0) {
    main_cold_13();
    return 1;
  }
  uVar5 = CVodeInit(0,local_d8,f,plVar7);
  if ((int)uVar5 < 0) {
LAB_00103836:
    pcVar15 = "CVodeInit";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSStolerances(0xe2308c3a,0x3e45798ee2308c3a,local_d8);
  if ((int)uVar5 < 0) {
LAB_00103853:
    pcVar15 = "CVodeSStolerances";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetUserData(local_d8,pauVar6);
  if ((int)uVar5 < 0) {
LAB_00103870:
    pcVar15 = "CVodeSetUserData";
    goto LAB_00103c23;
  }
  lVar11 = SUNDenseMatrix(3,3,local_c8);
  if (lVar11 == 0) {
    main_cold_12();
    return 1;
  }
  local_b8 = pauVar6;
  dVar12 = (double)SUNLinSol_Dense(plVar7,lVar11,local_c8);
  if (dVar12 == 0.0) {
    main_cold_11();
    return 1;
  }
  uVar5 = CVodeSetLinearSolver(local_d8,dVar12,lVar11);
  if ((int)uVar5 < 0) {
LAB_001038a1:
    pcVar15 = "CVodeSetLinearSolver";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadInit(local_d8,fQ,plVar8);
  if ((int)uVar5 < 0) {
LAB_001038be:
    pcVar15 = "CVodeQuadInit";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadSStolerances(0xe2308c3a,0x3e45798ee2308c3a,local_d8);
  if ((int)uVar5 < 0) {
LAB_001038db:
    pcVar15 = "CVodeQuadSStolerances";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetQuadErrCon(local_d8,1);
  if ((int)uVar5 < 0) {
LAB_001038f8:
    pcVar15 = "CVodeSetQuadErrCon";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSensInit(local_d8,2,1,fS,puVar9);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeSensInit";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSensEEtolerances(local_d8);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeSensEEtolerances";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetSensErrCon(local_d8,1);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeSetSensErrCon";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadSensInit(local_d8,fQS,puVar10);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeQuadSensInit";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadSensEEtolerances(local_d8);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeQuadSensEEtolerances";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetQuadSensErrCon(local_d8,1);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeSetQuadSensErrCon";
    goto LAB_00103c23;
  }
  uVar5 = CVodeAdjInit(local_d8,100,2);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeAdjInit";
    goto LAB_00103c23;
  }
  puts("-------------------");
  puts("Forward integration");
  puts("-------------------\n");
  uVar5 = CVodeF(0,local_d8,plVar7,local_c0,1,&local_5c);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeF";
    goto LAB_00103c23;
  }
  uVar5 = CVodeGetQuad(local_d8,local_c0,plVar8);
  if ((int)uVar5 < 0) goto LAB_001039a6;
  local_88 = **(double **)(*plVar8 + 0x10);
  uVar5 = CVodeGetSens(local_d8,local_c0,puVar9);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeGetSens";
    goto LAB_00103c23;
  }
  uVar5 = CVodeGetQuadSens(local_d8,local_c0,puVar10);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeGetQuadSens";
    goto LAB_00103c23;
  }
  printf("ncheck = %d\n",(ulong)local_5c);
  putchar(10);
  puVar2 = *(undefined8 **)(*plVar7 + 0x10);
  printf("     y:    %12.4e %12.4e %12.4e",(int)*puVar2,puVar2[1],puVar2[2]);
  printf("     G:    %12.4e\n",(int)**(undefined8 **)(*plVar8 + 0x10));
  putchar(10);
  puVar2 = *(undefined8 **)(*(long *)*puVar9 + 0x10);
  printf("     yS1:  %12.4e %12.4e %12.4e\n",(int)*puVar2,puVar2[1],puVar2[2]);
  puVar2 = *(undefined8 **)(*(long *)puVar9[1] + 0x10);
  printf("     yS2:  %12.4e %12.4e %12.4e\n",(int)*puVar2,puVar2[1],puVar2[2]);
  putchar(10);
  printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar10 + 0x10),
         **(undefined8 **)(*(long *)puVar10[1] + 0x10));
  putchar(10);
  puts("Final Statistics for forward pb.");
  puts("--------------------------------");
  uVar5 = PrintFwdStats(local_d8);
  if ((int)uVar5 < 0) {
    pcVar15 = "PrintFwdStats";
    goto LAB_00103c23;
  }
  local_78 = N_VNew_Serial(6,local_c8);
  if (local_78 == 0) {
    main_cold_10();
    return 1;
  }
  N_VConst(0,local_78);
  local_90 = (long *)N_VNew_Serial(4,local_c8);
  if (local_90 == (long *)0x0) {
    main_cold_9();
    return 1;
  }
  N_VConst(0,local_90);
  local_80 = N_VNew_Serial(6,local_c8);
  if (local_80 == 0) {
    main_cold_8();
    return 1;
  }
  N_VConst(0,local_80);
  local_98 = (long *)N_VNew_Serial(4,local_c8);
  if (local_98 == (long *)0x0) {
    main_cold_7();
    return 1;
  }
  N_VConst(0,local_98);
  uVar5 = CVodeCreateB(local_d8,2,&local_cc);
  if ((int)uVar5 < 0) {
LAB_00103a1a:
    pcVar15 = "CVodeCreateB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeInitBS(0,local_d8,local_cc,fB1,local_78);
  if ((int)uVar5 < 0) {
LAB_00103a54:
    pcVar15 = "CVodeInitBS";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_d8,local_cc);
  if ((int)uVar5 < 0) {
LAB_00103a8e:
    pcVar15 = "CVodeSStolerancesB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetUserDataB(local_d8,local_cc,local_b8);
  if ((int)uVar5 < 0) {
LAB_00103ac8:
    pcVar15 = "CVodeSetUserDataB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadInitBS(local_d8,local_cc,fQB1,local_90);
  if ((int)uVar5 < 0) {
LAB_00103aef:
    pcVar15 = "CVodeQuadInitBS";
    goto LAB_00103c23;
  }
  uVar5 = CVodeQuadSStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_d8,local_cc);
  if ((int)uVar5 < 0) {
LAB_00103b16:
    pcVar15 = "CVodeQuadSStolerancesB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeSetQuadErrConB(local_d8,local_cc,1);
  if ((int)uVar5 < 0) {
LAB_00103b3d:
    pcVar15 = "CVodeSetQuadErrConB";
    goto LAB_00103c23;
  }
  dVar13 = (double)SUNDenseMatrix(6,6,local_c8);
  if (lVar11 == 0) {
    main_cold_6();
    return 1;
  }
  local_a0 = dVar12;
  local_b0 = (double)SUNLinSol_Dense(local_78,dVar13,local_c8);
  if (local_b0 == 0.0) {
    main_cold_5();
    return 1;
  }
  local_a8 = dVar13;
  uVar5 = CVodeSetLinearSolverB(local_d8,local_cc,local_b0,dVar13);
  if ((int)uVar5 < 0) {
LAB_00103b64:
    pcVar15 = "CVodeSetLinearSolverB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeCreateB(local_d8,2,&local_d0);
  if ((int)uVar5 < 0) goto LAB_00103a1a;
  uVar5 = CVodeInitBS(0,local_d8,local_d0,fB2,local_80);
  if ((int)uVar5 < 0) goto LAB_00103a54;
  uVar5 = CVodeSStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_d8,local_d0);
  if ((int)uVar5 < 0) goto LAB_00103a8e;
  uVar5 = CVodeSetUserDataB(local_d8,local_d0,local_b8);
  if ((int)uVar5 < 0) goto LAB_00103ac8;
  uVar5 = CVodeQuadInitBS(local_d8,local_d0,fQB2,local_98);
  if ((int)uVar5 < 0) goto LAB_00103aef;
  uVar5 = CVodeQuadSStolerancesB(0xe2308c3a,0x3e45798ee2308c3a,local_d8,local_d0);
  if ((int)uVar5 < 0) goto LAB_00103b16;
  uVar5 = CVodeSetQuadErrConB(local_d8,local_d0,1);
  if ((int)uVar5 < 0) goto LAB_00103b3d;
  lVar14 = SUNDenseMatrix(6,6,local_c8);
  if (lVar14 == 0) {
    main_cold_4();
    return 1;
  }
  local_68 = (double)SUNLinSol_Dense(local_80,lVar14,local_c8);
  if (local_68 == 0.0) {
    main_cold_3();
    return 1;
  }
  uVar5 = CVodeSetLinearSolverB(local_d8,local_d0,local_68,lVar14);
  if ((int)uVar5 < 0) goto LAB_00103b64;
  puts("---------------------------------------------");
  puts("Backward integration ... (2 adjoint problems)");
  puts("---------------------------------------------\n");
  uVar5 = CVodeB(0,local_d8,1);
  if ((int)uVar5 < 0) {
    pcVar15 = "CVodeB";
    goto LAB_00103c23;
  }
  uVar5 = CVodeGetB(local_d8,local_cc,local_c0,local_78);
  if ((int)uVar5 < 0) {
LAB_00103b95:
    pcVar15 = "CVodeGetB";
  }
  else {
    uVar5 = CVodeGetQuadB(local_d8,local_cc,local_c0,local_90);
    if (-1 < (int)uVar5) {
      uVar5 = CVodeGetB(local_d8,local_d0,local_c0,local_80);
      plVar4 = local_98;
      if ((int)uVar5 < 0) goto LAB_00103b95;
      local_70 = (double)lVar14;
      uVar5 = CVodeGetQuadB(local_d8,local_d0,local_c0);
      if (-1 < (int)uVar5) {
        uVar1 = (*(undefined8 **)(*local_90 + 0x10))[1];
        printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n",
               (uint)**(undefined8 **)(*local_90 + 0x10) ^ (uint)DAT_00105020,
               CONCAT44((uint)((ulong)uVar1 >> 0x20) ^ DAT_00105020._4_4_,
                        (uint)uVar1 ^ (uint)DAT_00105020));
        uVar1 = (*(undefined8 **)(*plVar4 + 0x10))[1];
        printf("           %12.4e %12.4e   (from backward pb. 2)\n",
               (uint)**(undefined8 **)(*plVar4 + 0x10) ^ (uint)DAT_00105020,
               CONCAT44((uint)((ulong)uVar1 >> 0x20) ^ DAT_00105020._4_4_,
                        (uint)uVar1 ^ (uint)DAT_00105020));
        putchar(10);
        puts("   H = d2G/dp2:");
        puts("        (1)            (2)");
        plVar4 = local_90;
        uVar1 = *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10);
        printf("  %12.4e   %12.4e\n",
               (uint)*(undefined8 *)(*(long *)(*local_90 + 0x10) + 0x10) ^ (uint)DAT_00105020,
               CONCAT44((uint)((ulong)uVar1 >> 0x20) ^ DAT_00105020._4_4_,
                        (uint)uVar1 ^ (uint)DAT_00105020));
        printf("  %12.4e   %12.4e\n",(int)*(undefined8 *)(*(long *)(*plVar4 + 0x10) + 0x18),
               *(ulong *)(*(long *)(*local_98 + 0x10) + 0x18) ^ 0x8000000000000000);
        putchar(10);
        puts("Final Statistics for backward pb. 1");
        puts("-----------------------------------");
        uVar5 = PrintBckStats(local_d8,local_cc);
        if (-1 < (int)uVar5) {
          puts("Final Statistics for backward pb. 2");
          puts("-----------------------------------");
          uVar5 = PrintBckStats(local_d8,local_d0);
          if (-1 < (int)uVar5) {
            CVodeFree(&local_d8);
            SUNLinSolFree(local_a0);
            SUNMatDestroy(lVar11);
            SUNLinSolFree(local_b0);
            SUNMatDestroy(local_a8);
            SUNLinSolFree(local_68);
            SUNMatDestroy(local_70);
            puts("-----------------------");
            puts("Finite Difference tests");
            puts("-----------------------\n");
            printf("del_p = %g\n\n",0x47ae147b);
            local_d8 = (void *)CVodeCreate(2,local_c8);
            N_VConst(0,plVar7);
            N_VConst(0,plVar8);
            uVar5 = CVodeInit(0,local_d8,f,plVar7);
            if ((int)uVar5 < 0) goto LAB_00103836;
            uVar5 = CVodeSStolerances(0xe2308c3a,0x3e45798ee2308c3a,local_d8);
            if ((int)uVar5 < 0) goto LAB_00103853;
            uVar5 = CVodeSetUserData(local_d8,local_b8);
            if ((int)uVar5 < 0) goto LAB_00103870;
            lVar11 = SUNDenseMatrix(3,3,local_c8);
            if (lVar11 == 0) {
              main_cold_2();
              return 1;
            }
            lVar14 = SUNLinSol_Dense(plVar7,lVar11,local_c8);
            if (lVar14 == 0) {
              main_cold_1();
              return 1;
            }
            uVar5 = CVodeSetLinearSolver(local_d8,lVar14,lVar11);
            if ((int)uVar5 < 0) goto LAB_001038a1;
            uVar5 = CVodeQuadInit(local_d8,fQ,plVar8);
            if ((int)uVar5 < 0) goto LAB_001038be;
            uVar5 = CVodeQuadSStolerances(0xe2308c3a,0x3e45798ee2308c3a,local_d8);
            if ((int)uVar5 < 0) goto LAB_001038db;
            uVar5 = CVodeSetQuadErrCon(local_d8,1);
            if ((int)uVar5 < 0) goto LAB_001038f8;
            *(double *)*local_b8 = *(double *)*local_b8 + 0.01;
            uVar5 = CVode(0,local_d8,plVar7,local_c0,1);
            if ((int)uVar5 < 0) {
LAB_00103be3:
              pcVar15 = "CVode";
            }
            else {
              uVar5 = CVodeGetQuad(local_d8,local_c0,plVar8);
              if (-1 < (int)uVar5) {
                local_a0 = **(double **)(*plVar8 + 0x10);
                puVar2 = *(undefined8 **)(*plVar7 + 0x10);
                printf("p1+  y:   %12.4e %12.4e %12.4e",(int)*puVar2,puVar2[1],puVar2[2]);
                printf("     G:   %12.4e\n",(int)**(undefined8 **)(*plVar8 + 0x10));
                *(double *)*local_b8 = *(double *)*local_b8 + -0.02;
                N_VConst(0,plVar7);
                N_VConst(0,plVar8);
                CVodeReInit(0,local_d8,plVar7);
                CVodeQuadReInit(local_d8,plVar8);
                uVar5 = CVode(0,local_d8,plVar7,local_c0,1);
                if ((int)uVar5 < 0) goto LAB_00103be3;
                uVar5 = CVodeGetQuad(local_d8,local_c0,plVar8);
                if (-1 < (int)uVar5) {
                  local_b0 = **(double **)(*plVar8 + 0x10);
                  puVar2 = *(undefined8 **)(*plVar7 + 0x10);
                  printf("p1-  y:   %12.4e %12.4e %12.4e",(int)*puVar2,puVar2[1],puVar2[2]);
                  printf("     G:   %12.4e\n",(int)**(undefined8 **)(*plVar8 + 0x10));
                  dVar12 = *(double *)(*local_b8 + 8) + 0.01;
                  auVar3._8_4_ = SUB84(dVar12,0);
                  auVar3._0_8_ = *(double *)*local_b8 + 0.01;
                  auVar3._12_4_ = (int)((ulong)dVar12 >> 0x20);
                  *local_b8 = auVar3;
                  N_VConst(0,plVar7);
                  N_VConst(0,plVar8);
                  CVodeReInit(0,local_d8,plVar7);
                  CVodeQuadReInit(local_d8,plVar8);
                  uVar5 = CVode(0,local_d8,plVar7,local_c0,1);
                  if ((int)uVar5 < 0) goto LAB_00103be3;
                  uVar5 = CVodeGetQuad(local_d8,local_c0,plVar8);
                  if (-1 < (int)uVar5) {
                    local_a8 = **(double **)(*plVar8 + 0x10);
                    puVar2 = *(undefined8 **)(*plVar7 + 0x10);
                    printf("p2+  y:   %12.4e %12.4e %12.4e",(int)*puVar2,puVar2[1],puVar2[2]);
                    printf("     G:   %12.4e\n",(int)**(undefined8 **)(*plVar8 + 0x10));
                    *(double *)(*local_b8 + 8) = *(double *)(*local_b8 + 8) + -0.02;
                    N_VConst(0,plVar7);
                    N_VConst(0,plVar8);
                    CVodeReInit(0,local_d8,plVar7);
                    CVodeQuadReInit(local_d8,plVar8);
                    uVar5 = CVode(0,local_d8,plVar7,local_c0,1);
                    if ((int)uVar5 < 0) goto LAB_00103be3;
                    uVar5 = CVodeGetQuad(local_d8,local_c0,plVar8);
                    if (-1 < (int)uVar5) {
                      local_38 = (local_a0 - local_88) / 0.01;
                      local_70 = (local_88 - local_b0) / 0.01;
                      local_68 = (local_a0 - local_b0) / 0.02;
                      local_40 = local_88 + local_88;
                      local_a0 = ((local_a0 - local_40) + local_b0) / 0.0001;
                      local_48 = **(double **)(*plVar8 + 0x10);
                      puVar2 = *(undefined8 **)(*plVar7 + 0x10);
                      printf("p2-  y:   %12.4e %12.4e %12.4e",(int)*puVar2,puVar2[1],puVar2[2]);
                      printf("     G:   %12.4e\n",(int)**(undefined8 **)(*plVar8 + 0x10));
                      pauVar6 = local_b8;
                      *(double *)(*local_b8 + 8) = *(double *)(*local_b8 + 8) + 0.01;
                      local_58 = (local_a8 - local_88) / 0.01;
                      local_88 = (local_88 - local_48) / 0.01;
                      local_50 = (local_a8 - local_48) / 0.02;
                      local_a8 = ((local_a8 - local_40) + local_48) / 0.0001;
                      local_b0 = (double)lVar11;
                      putchar(10);
                      printf("   dG/dp:  %12.4e %12.4e   (fwd FD)\n",SUB84(local_38,0),local_58);
                      printf("           %12.4e %12.4e   (bck FD)\n",SUB84(local_70,0),local_88);
                      printf("           %12.4e %12.4e   (cntr FD)\n",SUB84(local_68,0),local_50);
                      putchar(10);
                      printf("  H(1,1):  %12.4e\n",SUB84(local_a0,0));
                      printf("  H(2,2):  %12.4e\n",SUB84(local_a8,0));
                      CVodeFree(&local_d8);
                      SUNLinSolFree(lVar14);
                      SUNMatDestroy(local_b0);
                      N_VDestroy(plVar7);
                      N_VDestroy(plVar8);
                      N_VDestroyVectorArray(puVar9,2);
                      N_VDestroyVectorArray(puVar10,2);
                      N_VDestroy(local_78);
                      N_VDestroy(local_90);
                      N_VDestroy(local_80);
                      N_VDestroy(local_98);
                      SUNContext_Free(&local_c8);
                      free(pauVar6);
                      return 0;
                    }
                  }
                }
              }
LAB_001039a6:
              pcVar15 = "CVodeGetQuad";
            }
            goto LAB_00103c23;
          }
        }
        pcVar15 = "PrintBckStats";
        goto LAB_00103c23;
      }
    }
    pcVar15 = "CVodeGetQuadB";
  }
LAB_00103c23:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar15,(ulong)uVar5);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;
  void* cvode_mem;

  sunindextype Neq, Np2;
  int Np;

  sunrealtype t0, tf;

  sunrealtype reltol;
  sunrealtype abstol, abstolQ, abstolB, abstolQB;

  N_Vector y, yQ;
  N_Vector *yS, *yQS;
  N_Vector yB1, yB2;
  N_Vector yQB1, yQB2;

  int steps, ncheck;
  int indexB1, indexB2;

  int retval;
  sunrealtype time;

  sunrealtype dp;
  sunrealtype G, Gp, Gm;
  sunrealtype grdG_fwd[2], grdG_bck[2], grdG_cntr[2];
  sunrealtype H11, H22;

  data = NULL;
  y = yQ = NULL;
  yB1 = yB2 = NULL;
  yQB1 = yQB2 = NULL;
  A = AB1 = AB2 = NULL;
  LS = LSB1 = LSB2 = NULL;
  cvode_mem        = NULL;

  /* User data structure */

  data     = (UserData)malloc(sizeof *data);
  data->p1 = SUN_RCONST(1.0);
  data->p2 = SUN_RCONST(2.0);

  /* Problem size, integration interval, and tolerances */

  Neq = 3;
  Np  = 2;
  Np2 = 2 * Np;

  t0 = 0.0;
  tf = 2.0;

  reltol = 1.0e-8;

  abstol  = 1.0e-8;
  abstolQ = 1.0e-8;

  abstolB  = 1.0e-8;
  abstolQB = 1.0e-8;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initializations for forward problem */

  y = N_VNew_Serial(Neq, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ONE, y);

  yQ = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)yQ, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQ);

  yS = N_VCloneVectorArray(Np, y);
  if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yS[0]);
  N_VConst(ZERO, yS[1]);

  yQS = N_VCloneVectorArray(Np, yQ);
  if (check_retval((void*)yQS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yQS[0]);
  N_VConst(ZERO, yQS[1]);

  /* Create and initialize forward problem */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  retval = CVodeSensInit(cvode_mem, Np, CV_SIMULTANEOUS, fS, yS);
  if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

  retval = CVodeSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

  retval = CVodeQuadSensInit(cvode_mem, fQS, yQS);
  if (check_retval(&retval, "CVodeQuadSensInit", 1)) { return (1); }

  retval = CVodeQuadSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeQuadSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetQuadSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadSensErrCon", 1)) { return (1); }

  /* Initialize ASA */

  steps  = 100;
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Forward integration */

  printf("-------------------\n");
  printf("Forward integration\n");
  printf("-------------------\n\n");

  retval = CVodeF(cvode_mem, tf, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  G = Ith(yQ, 1);

  retval = CVodeGetSens(cvode_mem, &time, yS);
  if (check_retval(&retval, "CVodeGetSens", 1)) { return (1); }

  retval = CVodeGetQuadSens(cvode_mem, &time, yQS);
  if (check_retval(&retval, "CVodeGetQuadSens", 1)) { return (1); }

  printf("ncheck = %d\n", ncheck);
  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     y:    %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4Le\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#else
  printf("     y:    %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4e\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4e %12.4e %12.4e\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4e %12.4e %12.4e\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#endif
  printf("\n");

  printf("Final Statistics for forward pb.\n");
  printf("--------------------------------\n");
  retval = PrintFwdStats(cvode_mem);
  if (check_retval(&retval, "PrintFwdStats", 1)) { return (1); }

  /* Initializations for backward problems */

  yB1 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB1);

  yQB1 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB1);

  yB2 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB2);

  yQB2 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB2);

  /* Create and initialize backward problems (one for each column of the Hessian) */

  /* -------------------------
     First backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB1);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB1, fB1, tf, yB1);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB1, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB1, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB1, fQB1, yQB1);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB1, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB1, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB1 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB1 = SUNLinSol_Dense(yB1, AB1, sunctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* -------------------------
     Second backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB2);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB2, fB2, tf, yB2);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB2, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB2, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB2, fQB2, yQB2);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB2, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB2, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB2 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB2 = SUNLinSol_Dense(yB2, AB2, sunctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Backward integration */

  printf("---------------------------------------------\n");
  printf("Backward integration ... (2 adjoint problems)\n");
  printf("---------------------------------------------\n\n");

  retval = CVodeB(cvode_mem, t0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB1, &time, yB1);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB1, &time, yQB1);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB2, &time, yB2);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB2, &time, yQB2);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4Le %12.4Le   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4e %12.4e   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#endif
  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#else
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#endif
  printf("\n");

  printf("Final Statistics for backward pb. 1\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB1);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  printf("Final Statistics for backward pb. 2\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB2);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /* Finite difference tests */

  dp = SUN_RCONST(1.0e-2);

  printf("-----------------------\n");
  printf("Finite Difference tests\n");
  printf("-----------------------\n\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("del_p = %Lg\n\n", dp);
#else
  printf("del_p = %g\n\n", dp);
#endif

  cvode_mem = CVodeCreate(CV_BDF, sunctx);

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  data->p1 += dp;

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 += dp;

  grdG_fwd[0]  = (Gp - G) / dp;
  grdG_bck[0]  = (G - Gm) / dp;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp);
  H11          = (Gp - 2.0 * G + Gm) / (dp * dp);

  data->p2 += dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 += dp;

  grdG_fwd[1]  = (Gp - G) / dp;
  grdG_bck[1]  = (G - Gm) / dp;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp);
  H22          = (Gp - 2.0 * G + Gm) / (dp * dp);

  printf("\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(y);
  N_VDestroy(yQ);

  N_VDestroyVectorArray(yS, Np);
  N_VDestroyVectorArray(yQS, Np);

  N_VDestroy(yB1);
  N_VDestroy(yQB1);
  N_VDestroy(yB2);
  N_VDestroy(yQB2);

  SUNContext_Free(&sunctx);

  free(data);

  return (0);
}